

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O2

void __thiscall
Assimp::DXFImporter::ParsePolyLineVertex(DXFImporter *this,LineReader *reader,PolyLine *line)

{
  int iVar1;
  pointer puVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  Logger *pLVar6;
  uint i;
  uint uVar7;
  ulong uVar8;
  float local_78;
  float local_74;
  float local_70;
  uint local_6c;
  uint local_68;
  value_type local_64;
  aiColor4D clr;
  uint indices [4];
  
  clr = AI_DXF_DEFAULT_COLOR;
  uVar7 = 0;
  local_70 = 0.0;
  local_74 = 0.0;
  local_78 = 0.0;
  uVar4 = 0;
  while (reader->end < 2) {
    iVar1 = reader->groupcode;
    if (iVar1 - 0x47U < 4) {
      if (uVar7 == 4) {
        pLVar6 = DefaultLogger::get();
        Logger::warn(pLVar6,"DXF: more than 4 indices per face not supported; ignoring");
        uVar7 = 4;
      }
      else {
        uVar5 = DXF::LineReader::ValueAsUnsignedInt(reader);
        uVar8 = (ulong)uVar7;
        uVar7 = uVar7 + 1;
        indices[uVar8] = uVar5;
      }
    }
    else if (iVar1 == 8) {
      bVar3 = std::operator!=(&reader->value,&line->layer);
      if (bVar3) {
        pLVar6 = DefaultLogger::get();
        Logger::warn(pLVar6,
                     "DXF: expected vertex to be part of a poly-face but the 0x128 flag isn\'t set")
        ;
      }
    }
    else if (iVar1 == 10) {
      local_70 = DXF::LineReader::ValueAsFloat(reader);
    }
    else if (iVar1 == 0x14) {
      local_74 = DXF::LineReader::ValueAsFloat(reader);
    }
    else if (iVar1 == 0x1e) {
      local_78 = DXF::LineReader::ValueAsFloat(reader);
    }
    else if (iVar1 == 0x3e) {
      uVar5 = DXF::LineReader::ValueAsUnsignedInt(reader);
      clr = *(aiColor4D *)((long)&g_aclrDxfIndexColors[0].r + (ulong)((uVar5 & 0xf) << 4));
    }
    else if (iVar1 == 0x46) {
      uVar4 = DXF::LineReader::ValueAsUnsignedInt(reader);
    }
    else if (iVar1 == 0) break;
    DXF::LineReader::operator++(reader);
  }
  local_64.z = local_78;
  local_64.y = local_74;
  local_64.x = local_70;
  local_6c = uVar7;
  if (((line->flags & 0x40) != 0) && ((uVar4 & 0x80) == 0)) {
    pLVar6 = DefaultLogger::get();
    Logger::warn(pLVar6,
                 "DXF: expected vertex to be part of a polyface but the 0x128 flag isn\'t set");
  }
  if (uVar7 == 0) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&line->positions,&local_64);
    std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back(&line->colors,&clr)
    ;
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&line->counts,&local_6c);
    for (uVar8 = 0; uVar8 < local_6c; uVar8 = uVar8 + 1) {
      if (indices[uVar8] == 0) {
        pLVar6 = DefaultLogger::get();
        Logger::warn(pLVar6,"DXF: invalid vertex index, indices are one-based.");
        puVar2 = (line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1;
        *puVar2 = *puVar2 - 1;
        puVar2 = (line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (puVar2[-1] == 0) {
          (line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar2 + -1;
        }
      }
      else {
        local_68 = indices[uVar8] - 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&line->indices,&local_68);
      }
    }
  }
  return;
}

Assistant:

void DXFImporter::ParsePolyLineVertex(DXF::LineReader& reader, DXF::PolyLine& line) {
    unsigned int cnti = 0, flags = 0;
    unsigned int indices[4];

    aiVector3D out;
    aiColor4D clr = AI_DXF_DEFAULT_COLOR;

    while( !reader.End() ) {

        if (reader.Is(0)) { // SEQEND or another VERTEX
            break;
        }

        switch (reader.GroupCode()) {
        case 8:
                // layer to which the vertex belongs to - assume that
                // this is always the layer the top-level poly-line
                // entity resides on as well.
                if(reader.Value() != line.layer) {
                    ASSIMP_LOG_WARN("DXF: expected vertex to be part of a poly-face but the 0x128 flag isn't set");
                }
                break;

        case 70:
                flags = reader.ValueAsUnsignedInt();
                break;

        // VERTEX COORDINATES
        case GroupCode_XComp:
            out.x = reader.ValueAsFloat();
            break;

        case GroupCode_YComp:
            out.y = reader.ValueAsFloat();
            break;

        case GroupCode_ZComp:
            out.z = reader.ValueAsFloat();
            break;

        // POLYFACE vertex indices
        case 71:
        case 72:
        case 73:
        case 74:
            if (cnti == 4) {
                ASSIMP_LOG_WARN("DXF: more than 4 indices per face not supported; ignoring");
                break;
            }
            indices[cnti++] = reader.ValueAsUnsignedInt();
            break;

        // color
        case 62:
            clr = g_aclrDxfIndexColors[reader.ValueAsUnsignedInt() % AI_DXF_NUM_INDEX_COLORS];
            break;
        };

        reader++;
    }

    if (line.flags & DXF_POLYLINE_FLAG_POLYFACEMESH && !(flags & DXF_VERTEX_FLAG_PART_OF_POLYFACE)) {
        ASSIMP_LOG_WARN("DXF: expected vertex to be part of a polyface but the 0x128 flag isn't set");
    }

    if (cnti) {
        line.counts.push_back(cnti);
        for (unsigned int i = 0; i < cnti; ++i) {
            // IMPORTANT NOTE: POLYMESH indices are ONE-BASED
            if (indices[i] == 0) {
                ASSIMP_LOG_WARN("DXF: invalid vertex index, indices are one-based.");
                --line.counts.back();
                // Workaround to fix issue 2229
                if (line.counts.back() == 0) {
                    line.counts.pop_back();
                }
                continue;
            }
            line.indices.push_back(indices[i]-1);
        }
    } else {
        line.positions.push_back(out);
        line.colors.push_back(clr);
    }
}